

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::InputFloat(char *label,float *v,float step,float step_fast,int decimal_precision,
                      ImGuiInputTextFlags extra_flags)

{
  bool bVar1;
  float *step_ptr;
  float *step_fast_ptr;
  float step_fast_local;
  float step_local;
  char display_format [16];
  
  step_fast_local = step_fast;
  step_local = step;
  if (decimal_precision < 0) {
    display_format[2] = '\0';
    display_format[0] = '%';
    display_format[1] = 'f';
  }
  else {
    ImFormatString(display_format,0x10,"%%.%df",decimal_precision);
  }
  step_ptr = &step_local;
  if (step <= 0.0) {
    step_ptr = (float *)0x0;
  }
  step_fast_ptr = &step_fast_local;
  if (step_fast <= 0.0) {
    step_fast_ptr = (float *)0x0;
  }
  bVar1 = InputScalarEx(label,ImGuiDataType_Float,v,step_ptr,step_fast_ptr,display_format,
                        extra_flags);
  return bVar1;
}

Assistant:

bool ImGui::InputFloat(const char* label, float* v, float step, float step_fast, int decimal_precision, ImGuiInputTextFlags extra_flags)
{
    char display_format[16];
    if (decimal_precision < 0)
        strcpy(display_format, "%f");      // Ideally we'd have a minimum decimal precision of 1 to visually denote that this is a float, while hiding non-significant digits? %f doesn't have a minimum of 1
    else
        ImFormatString(display_format, 16, "%%.%df", decimal_precision);
    return InputScalarEx(label, ImGuiDataType_Float, (void*)v, (void*)(step>0.0f ? &step : NULL), (void*)(step_fast>0.0f ? &step_fast : NULL), display_format, extra_flags);
}